

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O3

HashUtil * __thiscall
cfd::core::HashUtil::operator<<
          (HashUtil *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *bytes)

{
  ByteData local_30;
  
  if ((bytes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start !=
      (bytes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    ByteData::ByteData(&local_30,bytes);
    ByteData::Push(&this->buffer_,&local_30);
    if (local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_30.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return this;
}

Assistant:

HashUtil &HashUtil::operator<<(const std::vector<uint8_t> &bytes) {
  if (!bytes.empty()) buffer_.Push(ByteData(bytes));
  return *this;
}